

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

Node * __thiscall
sentencepiece::model::FreeList<sentencepiece::unigram::Lattice::Node>::Allocate
          (FreeList<sentencepiece::unigram::Lattice::Node> *this)

{
  size_type sVar1;
  ulong uVar2;
  value_type pNVar3;
  long lVar4;
  undefined1 auVar5 [16];
  size_type sVar6;
  ulong uVar7;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *__s;
  reference ppNVar8;
  long in_RDI;
  Node *result;
  Node *chunk;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *in_stack_ffffffffffffffb8;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *in_stack_ffffffffffffffc0;
  
  if (*(ulong *)(in_RDI + 0x30) <= *(ulong *)(in_RDI + 0x20)) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  sVar1 = *(size_type *)(in_RDI + 0x28);
  sVar6 = std::
          vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ::size((vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  *)(in_RDI + 8));
  if (sVar1 == sVar6) {
    uVar2 = *(ulong *)(in_RDI + 0x30);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar2;
    uVar7 = SUB168(auVar5 * ZEXT816(0x30),0);
    if (SUB168(auVar5 * ZEXT816(0x30),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    __s = (vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
           *)operator_new__(uVar7);
    if (uVar2 != 0) {
      in_stack_ffffffffffffffb8 = __s + uVar2 * 2;
      in_stack_ffffffffffffffc0 = __s;
      do {
        unigram::Lattice::Node::Node((Node *)0x488f0d);
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 2;
      } while (in_stack_ffffffffffffffc0 != in_stack_ffffffffffffffb8);
    }
    memset(__s,0,*(long *)(in_RDI + 0x30) * 0x30);
    std::
    vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
    ::push_back(in_stack_ffffffffffffffc0,(value_type *)in_stack_ffffffffffffffb8);
  }
  ppNVar8 = std::
            vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ::operator[]((vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                          *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
  pNVar3 = *ppNVar8;
  lVar4 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
  return pNVar3 + lVar4;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }